

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test3::test(GPUShaderFP64Test3 *this,uniformDataLayout uniform_data_layout)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  GLchar *local_358;
  MessageBuilder local_350;
  GLchar *local_1d0 [3];
  MessageBuilder local_1b8;
  byte local_31;
  programInfo *ppStack_30;
  bool result;
  programInfo *program_info;
  long lStack_20;
  bool offset_verification_result;
  Functions *gl;
  bool are_offsets_verified;
  GPUShaderFP64Test3 *pGStack_10;
  uniformDataLayout uniform_data_layout_local;
  GPUShaderFP64Test3 *this_local;
  
  gl._3_1_ = uniform_data_layout == STD140;
  gl._4_4_ = uniform_data_layout;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  program_info._7_1_ = 1;
  ppStack_30 = getProgramInfo(this,gl._4_4_);
  local_31 = 1;
  (**(code **)(lStack_20 + 0x1680))(ppStack_30->m_program_object_id);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1492);
  program_info._7_1_ = prepareUniformBuffer(this,ppStack_30,(bool)(gl._3_1_ & 1));
  if (((gl._3_1_ & 1) == 1) && (!(bool)program_info._7_1_)) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [24])"Uniform buffer layout: ");
    local_1d0[0] = getUniformLayoutName(this,gl._4_4_);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d0);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    local_31 = 0;
  }
  (**(code **)(lStack_20 + 0x50))(0x8c8e,0,this->m_transform_feedback_buffer_id,0,0x10);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x14a3);
  (**(code **)(lStack_20 + 0x30))(0);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x14a7);
  (**(code **)(lStack_20 + 0x538))(0xe,0,1);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x14ab);
  (**(code **)(lStack_20 + 0x638))();
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x14af);
  bVar1 = verifyResults(this);
  if (!bVar1) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_350,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [24])"Uniform buffer layout: ");
    local_358 = getUniformLayoutName(this,gl._4_4_);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_358);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    local_31 = 0;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool GPUShaderFP64Test3::test(uniformDataLayout uniform_data_layout) const
{
	bool				  are_offsets_verified		 = (STD140 == uniform_data_layout);
	const glw::Functions& gl						 = m_context.getRenderContext().getFunctions();
	bool				  offset_verification_result = true;
	const programInfo&	program_info				 = getProgramInfo(uniform_data_layout);
	bool				  result					 = true;

	/* Set up program */
	gl.useProgram(program_info.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare uniform buffer */
	offset_verification_result = prepareUniformBuffer(program_info, are_offsets_verified);

	if (true == are_offsets_verified && false == offset_verification_result)
	{
		/* Offsets verification failure was already reported, add info about buffer layout */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Uniform buffer layout: " << getUniformLayoutName(uniform_data_layout)
											<< tcu::TestLog::EndMessage;

		result = false;
	}

	/* Set up transform feedback buffer */
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_transform_feedback_buffer_id, 0, 4 * sizeof(glw::GLint));
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Begin transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	/* Execute draw call for singe vertex */
	gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Stop transform feedback */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Verify results */
	if (false == verifyResults())
	{
		/* Result verificatioon failure was already reported, add info about layout */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Uniform buffer layout: " << getUniformLayoutName(uniform_data_layout)
											<< tcu::TestLog::EndMessage;

		result = false;
	}

	/* Done */
	return result;
}